

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# literal.cpp
# Opt level: O0

Literal * __thiscall wasm::Literal::internalize(Literal *__return_storage_ptr__,Literal *this)

{
  bool bVar1;
  BasicHeapType BVar2;
  element_type *peVar3;
  Literal *pLVar4;
  shared_ptr<wasm::GCData> local_98;
  HeapType local_88;
  shared_ptr<wasm::GCData> local_80;
  HeapType local_70 [3];
  HeapType local_58;
  shared_ptr<wasm::GCData> local_50;
  HeapType local_40;
  Type local_38;
  Type local_30;
  HeapType local_28;
  Shareability local_1c;
  Literal *pLStack_18;
  Shareability share;
  Literal *this_local;
  
  pLStack_18 = this;
  this_local = __return_storage_ptr__;
  local_28 = wasm::Type::getHeapType(&this->type);
  local_1c = HeapType::getShared(&local_28);
  local_30.id = (this->type).id;
  BVar2 = HeapType::getBasic((HeapType *)&HeapTypes::ext,local_1c);
  HeapType::HeapType(&local_40,BVar2);
  wasm::Type::Type(&local_38,local_40,Nullable,Inexact);
  bVar1 = wasm::Type::isSubType(local_30,local_38);
  if (!bVar1) {
    __assert_fail("Type::isSubType(type, Type(HeapTypes::ext.getBasic(share), Nullable)) && \"can only internalize external references\""
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm/literal.cpp"
                  ,0xb5b,"Literal wasm::Literal::internalize() const");
  }
  bVar1 = isNull(this);
  if (bVar1) {
    std::shared_ptr<wasm::GCData>::shared_ptr(&local_50);
    BVar2 = HeapType::getBasic((HeapType *)&HeapTypes::none,local_1c);
    HeapType::HeapType(&local_58,BVar2);
    Literal(__return_storage_ptr__,&local_50,local_58);
    std::shared_ptr<wasm::GCData>::~shared_ptr(&local_50);
  }
  else {
    peVar3 = std::__shared_ptr_access<wasm::GCData,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<wasm::GCData,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)this);
    bVar1 = HeapType::isMaybeShared(&peVar3->type,i31);
    if (bVar1) {
      peVar3 = std::__shared_ptr_access<wasm::GCData,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<wasm::GCData,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)this);
      pLVar4 = SmallVector<wasm::Literal,_1UL>::operator[]
                         (&(peVar3->values).super_SmallVector<wasm::Literal,_1UL>,0);
      local_70[0] = wasm::Type::getHeapType(&pLVar4->type);
      bVar1 = HeapType::isMaybeShared(local_70,i31);
      if (!bVar1) {
        __assert_fail("gcData->values[0].type.getHeapType().isMaybeShared(HeapType::i31)",
                      "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm/literal.cpp"
                      ,0xb60,"Literal wasm::Literal::internalize() const");
      }
      peVar3 = std::__shared_ptr_access<wasm::GCData,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<wasm::GCData,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)this);
      pLVar4 = SmallVector<wasm::Literal,_1UL>::operator[]
                         (&(peVar3->values).super_SmallVector<wasm::Literal,_1UL>,0);
      Literal(__return_storage_ptr__,pLVar4);
    }
    else {
      peVar3 = std::__shared_ptr_access<wasm::GCData,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<wasm::GCData,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)this);
      bVar1 = HeapType::isMaybeShared(&peVar3->type,string);
      if (bVar1) {
        std::shared_ptr<wasm::GCData>::shared_ptr(&local_80,(shared_ptr<wasm::GCData> *)this);
        BVar2 = HeapType::getBasic((HeapType *)&HeapTypes::any,local_1c);
        HeapType::HeapType(&local_88,BVar2);
        Literal(__return_storage_ptr__,&local_80,local_88);
        std::shared_ptr<wasm::GCData>::~shared_ptr(&local_80);
      }
      else {
        std::shared_ptr<wasm::GCData>::shared_ptr(&local_98,(shared_ptr<wasm::GCData> *)this);
        peVar3 = std::__shared_ptr_access<wasm::GCData,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                 operator->((__shared_ptr_access<wasm::GCData,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)this);
        Literal(__return_storage_ptr__,&local_98,(HeapType)(peVar3->type).id);
        std::shared_ptr<wasm::GCData>::~shared_ptr(&local_98);
      }
    }
  }
  return __return_storage_ptr__;
}

Assistant:

Literal Literal::internalize() const {
  auto share = type.getHeapType().getShared();
  assert(
    Type::isSubType(type, Type(HeapTypes::ext.getBasic(share), Nullable)) &&
    "can only internalize external references");
  if (isNull()) {
    return Literal(std::shared_ptr<GCData>{}, HeapTypes::none.getBasic(share));
  }
  if (gcData->type.isMaybeShared(HeapType::i31)) {
    assert(gcData->values[0].type.getHeapType().isMaybeShared(HeapType::i31));
    return gcData->values[0];
  }
  if (gcData->type.isMaybeShared(HeapType::string)) {
    // Strings turn into anyref literals.
    return Literal(gcData, HeapTypes::any.getBasic(share));
  }
  return Literal(gcData, gcData->type);
}